

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void disableTerm(WhereLevel *pLevel,WhereTerm *pTerm)

{
  u8 uVar1;
  WhereTerm *pTerm_00;
  WhereTerm *pOther;
  WhereTerm *pTerm_local;
  WhereLevel *pLevel_local;
  
  if ((((pTerm != (WhereTerm *)0x0) && ((pTerm->wtFlags & 4) == 0)) &&
      ((pLevel->iLeftJoin == 0 || ((pTerm->pExpr->flags & 1) == 1)))) &&
     (pTerm->wtFlags = pTerm->wtFlags | 4, -1 < pTerm->iParent)) {
    pTerm_00 = pTerm->pWC->a + pTerm->iParent;
    uVar1 = pTerm_00->nChild + 0xff;
    pTerm_00->nChild = uVar1;
    if (uVar1 == '\0') {
      disableTerm(pLevel,pTerm_00);
    }
  }
  return;
}

Assistant:

static void disableTerm(WhereLevel *pLevel, WhereTerm *pTerm){
  if( pTerm
      && (pTerm->wtFlags & TERM_CODED)==0
      && (pLevel->iLeftJoin==0 || ExprHasProperty(pTerm->pExpr, EP_FromJoin))
  ){
    pTerm->wtFlags |= TERM_CODED;
    if( pTerm->iParent>=0 ){
      WhereTerm *pOther = &pTerm->pWC->a[pTerm->iParent];
      if( (--pOther->nChild)==0 ){
        disableTerm(pLevel, pOther);
      }
    }
  }
}